

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddRuleHash
          (cmGlobalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *content)

{
  cmState *this_00;
  string *psVar1;
  mapped_type *pmVar2;
  string fname;
  RuleHash hash;
  cmStateDirectory cmDir;
  string sStack_88;
  pointer local_68;
  pointer pBStack_60;
  pointer local_58;
  pointer puStack_50;
  cmStateDirectory local_48;
  
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)&sStack_88,AlgoMD5);
    cmCryptoHash::HashString((string *)&local_48,(cmCryptoHash *)&sStack_88,content);
    local_68 = ((local_48.DirectoryState.Tree)->Data).
               super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pBStack_60 = ((local_48.DirectoryState.Tree)->Data).
                 super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_58 = ((local_48.DirectoryState.Tree)->Data).
               super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puStack_50 = ((local_48.DirectoryState.Tree)->UpPositions).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&local_48);
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&sStack_88);
    cmMakefile::GetStateSnapshot
              (*(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_start);
    cmStateSnapshot::GetDirectory(&local_48,(cmStateSnapshot *)&sStack_88);
    this_00 = cmMakefile::GetState
                        (*(this->Makefiles).
                          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
    psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this_00);
    cmStateDirectory::ConvertToRelPathIfNotContained
              (&sStack_88,&local_48,psVar1,
               (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::operator[](&this->RuleHashes,&sStack_88);
    *(pointer *)(pmVar2->Data + 0x10) = local_58;
    *(pointer *)(pmVar2->Data + 0x18) = puStack_50;
    *(pointer *)pmVar2->Data = local_68;
    *(pointer *)(pmVar2->Data + 8) = pBStack_60;
    std::__cxx11::string::~string((string *)&sStack_88);
  }
  return;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}